

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

pqpair chisq_s2pq(double xx,double dof)

{
  double dVar1;
  double dVar2;
  pqpair pVar3;
  int which;
  double df;
  double x;
  double q;
  double p;
  int status;
  double bound;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_1c;
  double local_18;
  
  local_28 = 0.0;
  local_44 = 1;
  local_30 = 1.0;
  dVar1 = 0.0;
  dVar2 = 1.0;
  if ((0.0 < xx) && (0.0 < dof)) {
    local_40 = dof;
    local_38 = xx;
    cdfchi(&local_44,&local_28,&local_30,&local_38,&local_40,&local_1c,&local_18);
    dVar1 = local_28;
    dVar2 = local_30;
  }
  pVar3.q = dVar2;
  pVar3.p = dVar1;
  return pVar3;
}

Assistant:

static pqpair chisq_s2pq( double xx , double dof )
{
   int which , status ;
   double p,q,x,df,bound ;
   pqpair pq={0.0,1.0} ;

   which  = 1 ;
   p      = 0.0 ;
   q      = 1.0 ;
   x      = xx ;  if(   x <= 0.0 ) return pq ;
   df     = dof ; if( dof <= 0.0 ) return pq ;

   cdfchi( &which , &p , &q , &x , &df , &status , &bound ) ;
   pq.p = p ; pq.q = q ; return pq ;
}